

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

factor * __thiscall
merlin::factor::logsumexp(factor *__return_storage_ptr__,factor *this,variable_set *sum_out)

{
  pointer pdVar1;
  double dVar2;
  variable_set target;
  factor Scaled;
  variable_set local_110;
  factor local_d8;
  factor local_78;
  
  variable_set::operator-(&local_110,&this->v_,sum_out);
  maxmarginal(__return_storage_ptr__,this,&local_110);
  binaryOp<merlin::factor::binOpMinus>(&local_78,this,__return_storage_ptr__);
  for (pdVar1 = local_78.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != local_78.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    dVar2 = exp(*pdVar1);
    *pdVar1 = dVar2;
  }
  marginal(&local_d8,&local_78,&local_110);
  for (pdVar1 = local_d8.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != local_d8.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    dVar2 = log(*pdVar1);
    *pdVar1 = dVar2;
  }
  binaryOpIP<merlin::factor::binOpPlus>(__return_storage_ptr__,&local_d8);
  ~factor(&local_d8);
  ~factor(&local_78);
  variable_set::~variable_set(&local_110);
  return __return_storage_ptr__;
}

Assistant:

factor logsumexp(const variable_set& sum_out) const {
		variable_set target = v_ - sum_out;
		factor mx = maxmarginal(target);
		factor Scaled = *this - mx;
		Scaled.exp();
		mx += Scaled.marginal(target).log();
		return mx;
	}